

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vtabCallConstructor(sqlite3 *db,Table *pTab,Module *pMod,
                       _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                       *xConstruct,char **pzErr)

{
  int iVar1;
  char **ppcVar2;
  sqlite3_vtab *psVar3;
  VTable *pVTab;
  byte bVar4;
  int iVar5;
  VtabCtx *pVVar6;
  VTable *pVVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  ulong uVar12;
  uint uVar13;
  Schema **ppSVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  char *zErr;
  VtabCtx sCtx;
  Column *local_78;
  short local_68;
  char *local_60;
  VTable *local_58;
  VtabCtx local_50;
  
  ppcVar2 = pTab->azModuleArg;
  iVar1 = pTab->nModuleArg;
  local_60 = (char *)0x0;
  for (pVVar6 = db->pVtabCtx; pVVar6 != (VtabCtx *)0x0; pVVar6 = pVVar6->pPrior) {
    if (pVVar6->pTab == pTab) {
      pcVar9 = sqlite3MPrintf(db,"vtable constructor called recursively: %s",pTab->zName);
      *pzErr = pcVar9;
      return 6;
    }
  }
  pcVar9 = sqlite3MPrintf(db,"%s",pTab->zName);
  iVar5 = 7;
  if (pcVar9 == (char *)0x0) {
    return 7;
  }
  pVVar7 = (VTable *)sqlite3DbMallocZero(db,0x30);
  if (pVVar7 != (VTable *)0x0) {
    pVVar7->db = db;
    pVVar7->pMod = pMod;
    if (pTab->pSchema == (Schema *)0x0) {
      uVar12 = 0xfff0bdc0;
    }
    else {
      uVar13 = db->nDb;
      if ((int)uVar13 < 1) {
        uVar12 = 0;
      }
      else {
        ppSVar14 = &db->aDb->pSchema;
        uVar8 = 0;
        do {
          uVar12 = uVar8;
          if (*ppSVar14 == pTab->pSchema) break;
          uVar8 = uVar8 + 1;
          ppSVar14 = ppSVar14 + 4;
          uVar12 = (ulong)uVar13;
        } while (uVar13 != uVar8);
      }
    }
    pTab->azModuleArg[1] = db->aDb[(int)uVar12].zDbSName;
    local_50.pPrior = db->pVtabCtx;
    local_50.bDeclared = 0;
    db->pVtabCtx = &local_50;
    local_58 = pVVar7;
    local_50.pVTable = pVVar7;
    local_50.pTab = pTab;
    iVar5 = (*xConstruct)(db,pMod->pAux,iVar1,ppcVar2,&pVVar7->pVtab,&local_60);
    pVTab = local_58;
    db->pVtabCtx = local_50.pPrior;
    if (iVar5 == 0) {
      psVar3 = pVVar7->pVtab;
      iVar5 = 0;
      if (psVar3 != (sqlite3_vtab *)0x0) {
        psVar3->pModule = (sqlite3_module *)0x0;
        *(undefined8 *)&psVar3->nRef = 0;
        psVar3->zErrMsg = (char *)0x0;
        local_58->pVtab->pModule = pMod->pModule;
        local_58->nRef = 1;
        if (local_50.bDeclared == 0) {
          pcVar10 = sqlite3MPrintf(db,"vtable constructor did not declare schema: %s",pTab->zName);
          *pzErr = pcVar10;
          sqlite3VtabUnlock(pVTab);
          iVar5 = 1;
          goto LAB_0021c56b;
        }
        local_58->pNext = pTab->pVTable;
        pTab->pVTable = local_58;
        local_68 = pTab->nCol;
        if (local_68 < 1) goto LAB_0021c56b;
        local_78 = pTab->aCol;
        lVar18 = 0;
        bVar4 = 0;
        do {
          pcVar10 = "";
          if ((local_78[lVar18].colFlags & 4) != 0) {
            pcVar10 = local_78[lVar18].zName;
            sVar11 = strlen(pcVar10);
            pcVar10 = pcVar10 + sVar11 + 1;
          }
          sVar11 = strlen(pcVar10);
          if ((sVar11 & 0x3fffffff) != 0) {
            uVar12 = (ulong)((uint)sVar11 & 0x3fffffff);
            uVar8 = 0;
            pcVar15 = pcVar10;
LAB_0021c470:
            lVar16 = 0;
            do {
              if (""[(byte)"hidden"[lVar16]] != ""[(byte)pcVar15[lVar16]]) goto LAB_0021c4a8;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 6);
            if (((uVar8 != 0) && (pcVar10[uVar8 - 1] != ' ')) || ((pcVar10[uVar8 + 6] & 0xdfU) != 0)
               ) goto LAB_0021c4a8;
            uVar13 = 7 - (pcVar10[uVar8 + 6] == 0);
            uVar17 = uVar8;
            if (uVar13 + (int)uVar8 <= ((uint)sVar11 & 0x3fffffff)) {
              do {
                pcVar10[uVar17] = pcVar10[uVar17 + uVar13];
                lVar16 = uVar13 + uVar17;
                uVar17 = uVar17 + 1;
              } while (lVar16 + 1U <= uVar12);
            }
            if ((uVar8 != 0) && (pcVar10[uVar8] == '\0')) {
              pcVar10[uVar8 - 1] = '\0';
            }
            local_78 = pTab->aCol;
            local_78[lVar18].colFlags = local_78[lVar18].colFlags | 2;
            local_68 = pTab->nCol;
            bVar4 = 0x80;
            goto LAB_0021c520;
          }
LAB_0021c4b3:
          pTab->tabFlags = pTab->tabFlags | (uint)bVar4;
LAB_0021c520:
          lVar18 = lVar18 + 1;
        } while (lVar18 < local_68);
      }
      iVar5 = 0;
    }
    else {
      if (((iVar5 == 7) && (db->mallocFailed == '\0')) && (db->bBenignMalloc == '\0')) {
        db->mallocFailed = '\x01';
        if (0 < db->nVdbeExec) {
          (db->u1).isInterrupted = 1;
        }
        (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
      }
      if (local_60 == (char *)0x0) {
        pcVar10 = sqlite3MPrintf(db,"vtable constructor failed: %s",pcVar9);
        *pzErr = pcVar10;
      }
      else {
        pcVar10 = sqlite3MPrintf(db,"%s");
        *pzErr = pcVar10;
        sqlite3_free(local_60);
      }
      sqlite3DbFreeNN(db,local_58);
    }
  }
LAB_0021c56b:
  sqlite3DbFreeNN(db,pcVar9);
  return iVar5;
LAB_0021c4a8:
  uVar8 = uVar8 + 1;
  pcVar15 = pcVar15 + 1;
  if (uVar8 == uVar12) goto LAB_0021c4b3;
  goto LAB_0021c470;
}

Assistant:

static int vtabCallConstructor(
  sqlite3 *db, 
  Table *pTab,
  Module *pMod,
  int (*xConstruct)(sqlite3*,void*,int,const char*const*,sqlite3_vtab**,char**),
  char **pzErr
){
  VtabCtx sCtx;
  VTable *pVTable;
  int rc;
  const char *const*azArg = (const char *const*)pTab->azModuleArg;
  int nArg = pTab->nModuleArg;
  char *zErr = 0;
  char *zModuleName;
  int iDb;
  VtabCtx *pCtx;

  /* Check that the virtual-table is not already being initialized */
  for(pCtx=db->pVtabCtx; pCtx; pCtx=pCtx->pPrior){
    if( pCtx->pTab==pTab ){
      *pzErr = sqlite3MPrintf(db, 
          "vtable constructor called recursively: %s", pTab->zName
      );
      return SQLITE_LOCKED;
    }
  }

  zModuleName = sqlite3MPrintf(db, "%s", pTab->zName);
  if( !zModuleName ){
    return SQLITE_NOMEM_BKPT;
  }

  pVTable = sqlite3DbMallocZero(db, sizeof(VTable));
  if( !pVTable ){
    sqlite3DbFree(db, zModuleName);
    return SQLITE_NOMEM_BKPT;
  }
  pVTable->db = db;
  pVTable->pMod = pMod;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  pTab->azModuleArg[1] = db->aDb[iDb].zDbSName;

  /* Invoke the virtual table constructor */
  assert( &db->pVtabCtx );
  assert( xConstruct );
  sCtx.pTab = pTab;
  sCtx.pVTable = pVTable;
  sCtx.pPrior = db->pVtabCtx;
  sCtx.bDeclared = 0;
  db->pVtabCtx = &sCtx;
  rc = xConstruct(db, pMod->pAux, nArg, azArg, &pVTable->pVtab, &zErr);
  db->pVtabCtx = sCtx.pPrior;
  if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
  assert( sCtx.pTab==pTab );

  if( SQLITE_OK!=rc ){
    if( zErr==0 ){
      *pzErr = sqlite3MPrintf(db, "vtable constructor failed: %s", zModuleName);
    }else {
      *pzErr = sqlite3MPrintf(db, "%s", zErr);
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db, pVTable);
  }else if( ALWAYS(pVTable->pVtab) ){
    /* Justification of ALWAYS():  A correct vtab constructor must allocate
    ** the sqlite3_vtab object if successful.  */
    memset(pVTable->pVtab, 0, sizeof(pVTable->pVtab[0]));
    pVTable->pVtab->pModule = pMod->pModule;
    pVTable->nRef = 1;
    if( sCtx.bDeclared==0 ){
      const char *zFormat = "vtable constructor did not declare schema: %s";
      *pzErr = sqlite3MPrintf(db, zFormat, pTab->zName);
      sqlite3VtabUnlock(pVTable);
      rc = SQLITE_ERROR;
    }else{
      int iCol;
      u8 oooHidden = 0;
      /* If everything went according to plan, link the new VTable structure
      ** into the linked list headed by pTab->pVTable. Then loop through the 
      ** columns of the table to see if any of them contain the token "hidden".
      ** If so, set the Column COLFLAG_HIDDEN flag and remove the token from
      ** the type string.  */
      pVTable->pNext = pTab->pVTable;
      pTab->pVTable = pVTable;

      for(iCol=0; iCol<pTab->nCol; iCol++){
        char *zType = sqlite3ColumnType(&pTab->aCol[iCol], "");
        int nType;
        int i = 0;
        nType = sqlite3Strlen30(zType);
        for(i=0; i<nType; i++){
          if( 0==sqlite3StrNICmp("hidden", &zType[i], 6)
           && (i==0 || zType[i-1]==' ')
           && (zType[i+6]=='\0' || zType[i+6]==' ')
          ){
            break;
          }
        }
        if( i<nType ){
          int j;
          int nDel = 6 + (zType[i+6] ? 1 : 0);
          for(j=i; (j+nDel)<=nType; j++){
            zType[j] = zType[j+nDel];
          }
          if( zType[i]=='\0' && i>0 ){
            assert(zType[i-1]==' ');
            zType[i-1] = '\0';
          }
          pTab->aCol[iCol].colFlags |= COLFLAG_HIDDEN;
          oooHidden = TF_OOOHidden;
        }else{
          pTab->tabFlags |= oooHidden;
        }
      }
    }
  }

  sqlite3DbFree(db, zModuleName);
  return rc;
}